

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O2

int __thiscall spdlog::details::file_helper::close(file_helper *this,int __fd)

{
  int in_EAX;
  int extraout_EAX;
  FILE *__stream;
  
  __stream = (FILE *)this->fd_;
  if (__stream != (FILE *)0x0) {
    if ((this->event_handlers_).before_close.super__Function_base._M_manager != (_Manager_type)0x0)
    {
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,__IO_FILE_*)>
      ::operator()(&(this->event_handlers_).before_close,&this->filename_,(_IO_FILE *)__stream);
      __stream = (FILE *)this->fd_;
    }
    in_EAX = fclose(__stream);
    this->fd_ = (FILE *)0x0;
    if ((this->event_handlers_).after_close.super__Function_base._M_manager != (_Manager_type)0x0) {
      CLI::std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&(this->event_handlers_).after_close,&this->filename_);
      return extraout_EAX;
    }
  }
  return in_EAX;
}

Assistant:

SPDLOG_INLINE void file_helper::close() {
    if (fd_ != nullptr) {
        if (event_handlers_.before_close) {
            event_handlers_.before_close(filename_, fd_);
        }

        std::fclose(fd_);
        fd_ = nullptr;

        if (event_handlers_.after_close) {
            event_handlers_.after_close(filename_);
        }
    }
}